

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O0

DdNode * Llb_ManComputeInitState(Llb_Man_t *p,DdManager *dd)

{
  abctime aVar1;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  int iVar2;
  Aig_Obj_t *pObj_00;
  DdNode *pDVar3;
  int local_60;
  abctime TimeStop;
  int iVar;
  int i;
  DdNode *bTemp;
  DdNode *bVar;
  DdNode *bRes;
  Aig_Obj_t *pObj;
  DdManager *dd_local;
  Llb_Man_t *p_local;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  bVar = Cudd_ReadOne(dd);
  Cudd_Ref(bVar);
  for (TimeStop._4_4_ = 0; iVar2 = Saig_ManRegNum(p->pAig), TimeStop._4_4_ < iVar2;
      TimeStop._4_4_ = TimeStop._4_4_ + 1) {
    p_00 = p->pAig->vCis;
    iVar2 = Saig_ManPiNum(p->pAig);
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p_00,TimeStop._4_4_ + iVar2);
    if (dd == p->ddG) {
      local_60 = TimeStop._4_4_;
    }
    else {
      p_01 = p->vObj2Var;
      iVar2 = Aig_ObjId(pObj_00);
      local_60 = Vec_IntEntry(p_01,iVar2);
    }
    pDVar3 = Cudd_bddIthVar(dd,local_60);
    pDVar3 = Cudd_bddAnd(dd,bVar,(DdNode *)((ulong)pDVar3 ^ 1));
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,bVar);
    bVar = pDVar3;
  }
  Cudd_Deref(bVar);
  dd->TimeStop = aVar1;
  return bVar;
}

Assistant:

DdNode * Llb_ManComputeInitState( Llb_Man_t * p, DdManager * dd )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bVar, * bTemp;
    int i, iVar;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        iVar  = (dd == p->ddG) ? i : Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj));
        bVar  = Cudd_bddIthVar( dd, iVar );
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}